

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid,H264_FrameStore_t *fs)

{
  h264_store_pic_t *phVar1;
  MPP_RET MVar2;
  H264_StorePic_t *pHVar3;
  H264_StorePic_t *p;
  MPP_RET ret;
  H264_FrameStore_t *fs_local;
  H264dVideoCtx_t *p_Vid_local;
  
  if (2 < fs->is_used) {
    if ((h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x3b6);
    return MPP_ERR_VALUE;
  }
  if ((fs->is_used & 1U) != 0) {
    phVar1 = fs->top_field;
    pHVar3 = alloc_storable_picture(p_Vid,2);
    fs->bottom_field = pHVar3;
    if (fs->bottom_field == (h264_store_pic_t *)0x0) {
      if ((h264d_debug & 1) == 0) {
        return MPP_ERR_MALLOC;
      }
      _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x3ba);
      return MPP_ERR_MALLOC;
    }
    fs->bottom_field->mem_malloc_type = Mem_UnPaired;
    fs->bottom_field->chroma_format_idc = phVar1->chroma_format_idc;
    MVar2 = dpb_combine_field_yuv(p_Vid,fs,'\0');
    if (MVar2 < MPP_OK) {
      if ((h264d_debug & 4) == 0) {
        return MVar2;
      }
      _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x3bd);
      return MVar2;
    }
    fs->frame->view_id = fs->view_id;
    fs->frame->mem_malloc_type = Mem_TopOnly;
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3c0);
    }
    write_picture(fs->frame,p_Vid);
  }
  if ((fs->is_used & 2U) == 0) {
LAB_001cc545:
    fs->is_used = 3;
    return MPP_OK;
  }
  phVar1 = fs->bottom_field;
  pHVar3 = alloc_storable_picture(p_Vid,1);
  fs->top_field = pHVar3;
  if (fs->top_field == (h264_store_pic_t *)0x0) {
    p._4_4_ = MPP_ERR_MALLOC;
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x3c7);
    }
  }
  else {
    fs->top_field->mem_malloc_type = Mem_UnPaired;
    fs->top_field->chroma_format_idc = phVar1->chroma_format_idc;
    fs->top_field->frame_cropping_flag = fs->bottom_field->frame_cropping_flag;
    if (fs->top_field->frame_cropping_flag != 0) {
      fs->top_field->frame_crop_top_offset = fs->bottom_field->frame_crop_top_offset;
      fs->top_field->frame_crop_bottom_offset = fs->bottom_field->frame_crop_bottom_offset;
      fs->top_field->frame_crop_left_offset = fs->bottom_field->frame_crop_left_offset;
      fs->top_field->frame_crop_right_offset = fs->bottom_field->frame_crop_right_offset;
    }
    p._4_4_ = dpb_combine_field_yuv(p_Vid,fs,'\0');
    if (MPP_NOK < p._4_4_) {
      fs->frame->view_id = fs->view_id;
      fs->frame->mem_malloc_type = Mem_BotOnly;
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3d4);
      }
      write_picture(fs->frame,p_Vid);
      goto LAB_001cc545;
    }
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x3d1);
    }
  }
  return p._4_4_;
}

Assistant:

static MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid, H264_FrameStore_t *fs)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *p = NULL;

    VAL_CHECK(ret, fs->is_used < 3);
    if (fs->is_used & 0x01) { // we have a top field, construct an empty bottom field
        p = fs->top_field;
        fs->bottom_field = alloc_storable_picture(p_Vid, BOTTOM_FIELD);
        MEM_CHECK(ret, fs->bottom_field);
        fs->bottom_field->mem_malloc_type = Mem_UnPaired;
        fs->bottom_field->chroma_format_idc = p->chroma_format_idc;
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_TopOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }

    if (fs->is_used & 0x02) { // we have a bottom field, construct an empty top field
        p = fs->bottom_field;
        fs->top_field = alloc_storable_picture(p_Vid, TOP_FIELD);
        MEM_CHECK(ret, fs->top_field);
        fs->top_field->mem_malloc_type = Mem_UnPaired;
        fs->top_field->chroma_format_idc = p->chroma_format_idc;
        fs->top_field->frame_cropping_flag = fs->bottom_field->frame_cropping_flag;
        if (fs->top_field->frame_cropping_flag) {
            fs->top_field->frame_crop_top_offset = fs->bottom_field->frame_crop_top_offset;
            fs->top_field->frame_crop_bottom_offset = fs->bottom_field->frame_crop_bottom_offset;
            fs->top_field->frame_crop_left_offset = fs->bottom_field->frame_crop_left_offset;
            fs->top_field->frame_crop_right_offset = fs->bottom_field->frame_crop_right_offset;
        }
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_BotOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }
    fs->is_used = 3;

    return ret = MPP_OK;
__FAILED:
    return ret;
}